

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_melt_rock(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  OBJ_DATA *pOVar3;
  CHAR_DATA *in_RCX;
  long in_RDX;
  int dam;
  int iWear;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  undefined1 in_stack_000012f2;
  undefined1 in_stack_000012f3;
  int in_stack_000012f4;
  int in_stack_000012f8;
  int in_stack_000012fc;
  CHAR_DATA *in_stack_00001300;
  CHAR_DATA *in_stack_00001308;
  int in_stack_00001328;
  int in_stack_00001330;
  char *in_stack_00001338;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  OBJ_DATA *in_stack_ffffffffffffffa0;
  int local_34;
  
  act(in_stack_ffffffffffffff90,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
      (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
      (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
  act(in_stack_ffffffffffffff90,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
      (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
      (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
  act(in_stack_ffffffffffffff90,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
      (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
      (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
  for (local_34 = 0; local_34 < 0x16; local_34 = local_34 + 1) {
    pOVar3 = get_eq_char(in_RCX,local_34);
    if ((((pOVar3 != (OBJ_DATA *)0x0) && (local_34 != 0x10)) && (local_34 != 0x12)) &&
       (((bVar1 = is_obj_stat((OBJ_DATA *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                              in_stack_ffffffffffffff84), !bVar1 &&
         (bVar1 = is_stone((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                          ), bVar1)) &&
        (iVar2 = number_range(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c),
        iVar2 <= (int)*(short *)(in_RDX + 0x138) / 2 + 0x28)))) {
      act(in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      act(in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      act(in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      dice(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      in_stack_ffffffffffffff78 = 0;
      in_stack_ffffffffffffff80 = 0;
      in_stack_ffffffffffffff88 = 1;
      in_stack_ffffffffffffff90 = "The molten rock*";
      damage_new(in_stack_00001308,in_stack_00001300,in_stack_000012fc,in_stack_000012f8,
                 in_stack_000012f4,(bool)in_stack_000012f3,(bool)in_stack_000012f2,in_stack_00001328
                 ,in_stack_00001330,in_stack_00001338);
      extract_obj(in_stack_ffffffffffffffa0);
    }
  }
  iVar2 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = is_affected(in_RCX,iVar2);
  if (bVar1) {
    skill_lookup((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    bVar1 = check_dispel((int)in_stack_ffffffffffffff90,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84);
    if (bVar1) {
      act(in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      act(in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      act(in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      dice(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      damage_new(in_stack_00001308,in_stack_00001300,in_stack_000012fc,in_stack_000012f8,
                 in_stack_000012f4,(bool)in_stack_000012f3,(bool)in_stack_000012f2,in_stack_00001328
                 ,in_stack_00001330,in_stack_00001338);
    }
  }
  return;
}

Assistant:

void spell_melt_rock(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *obj;
	int iWear, dam;

	act("A wave of oppressive heat emanates from your fingertips as you gesture at $N.", ch, 0, victim, TO_CHAR);
	act("As $n gestures, a wave of oppressive heat washes over you.", ch, 0, victim, TO_VICT);
	act("$n gestures, sending a wave of oppressive heat washing over $N.", ch, 0, victim, TO_NOTVICT);

	for (iWear = 0; iWear < MAX_WEAR; iWear++)
	{
		obj = get_eq_char(victim, iWear);

		if (obj == nullptr || iWear == WEAR_WIELD || iWear == WEAR_DUAL_WIELD)
			continue;

		if (is_obj_stat(obj, ITEM_BURN_PROOF))
			continue;

		if (!is_stone(obj))
			continue;

		if (number_range(0, 100) > (40 + (ch->level / 2)))
			continue;

		act("$p melts under the intense heat, scorching you!", ch, obj, victim, TO_VICT);
		act("$p melts under the intense heat, scorching $m!", ch, obj, victim, TO_CHAR);
		act("$p melts under the intense heat, scorching $m!", ch, obj, victim, TO_NOTVICT);

		dam = dice(obj->level, 2) / 2;

		damage_new(ch, victim, dam, sn, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "The molten rock*");
		extract_obj(obj);
	}

	if (is_affected(victim, skill_lookup("stoneskin")))
	{
		if (check_dispel(ch->level + 3, victim, skill_lookup("stoneskin")))
		{
			act("Your stoneskin melts under the intense heat, scorching you!", ch, obj, victim, TO_VICT);
			act("$N's stoneskin melts under the intense heat, scorching $m!", ch, obj, victim, TO_CHAR);
			act("$N's stoneskin melts under the intense heat, scorching $m!", ch, obj, victim, TO_NOTVICT);

			damage_new(ch, victim, dice(ch->level, 10), sn, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "The molten rock*");
		}
	}
}